

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_core.cpp
# Opt level: O0

void QTest::qSleep(milliseconds msecs)

{
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  
  __rtime = *(duration<long,_std::ratio<1L,_1000L>_> **)(in_FS_OFFSET + 0x28);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
  if (*(duration<long,_std::ratio<1L,_1000L>_> **)(in_FS_OFFSET + 0x28) == __rtime) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTest::qSleep(std::chrono::milliseconds msecs)
{
    Q_ASSERT(msecs > 0ms);
    std::this_thread::sleep_for(msecs);
}